

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

int ImGui_ImplGlfw_KeyToModifier(int key)

{
  int key_local;
  undefined4 local_4;
  
  if ((key == 0x155) || (key == 0x159)) {
    local_4 = 2;
  }
  else if ((key == 0x154) || (key == 0x158)) {
    local_4 = 1;
  }
  else if ((key == 0x156) || (key == 0x15a)) {
    local_4 = 4;
  }
  else if ((key == 0x157) || (key == 0x15b)) {
    local_4 = 8;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ImGui_ImplGlfw_KeyToModifier(int key)
{
    if (key == GLFW_KEY_LEFT_CONTROL || key == GLFW_KEY_RIGHT_CONTROL)
        return GLFW_MOD_CONTROL;
    if (key == GLFW_KEY_LEFT_SHIFT || key == GLFW_KEY_RIGHT_SHIFT)
        return GLFW_MOD_SHIFT;
    if (key == GLFW_KEY_LEFT_ALT || key == GLFW_KEY_RIGHT_ALT)
        return GLFW_MOD_ALT;
    if (key == GLFW_KEY_LEFT_SUPER || key == GLFW_KEY_RIGHT_SUPER)
        return GLFW_MOD_SUPER;
    return 0;
}